

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O2

void __thiscall tl::StrT<char32_t>::eraseRange(StrT<char32_t> *this,u32 from,u32 to)

{
  uint uVar1;
  char32_t *pcVar2;
  int iVar3;
  ulong uVar4;
  
  iVar3 = to - from;
  if ((from <= to) && (uVar1 = this->_size, to <= uVar1)) {
    pcVar2 = this->_str;
    for (uVar4 = (ulong)to; (uint)uVar4 < uVar1; uVar4 = uVar4 + 1) {
      pcVar2[from] = pcVar2[uVar4];
      from = from + 1;
    }
    resize(this,uVar1 - iVar3);
    return;
  }
  __assert_fail("from <= to && to <= _size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/tl/tl/str.cpp"
                ,299,"void tl::StrT<char32_t>::eraseRange(u32, u32) [CharT = char32_t]");
}

Assistant:

void StrT<CharT>::eraseRange(u32 from, u32 to)
{
    const u32 prevSize = _size;
    assert(from <= to && to <= _size);

    const u32 nToDel = to - from;
    for(u32 i = from; i + nToDel < prevSize; i++) {
        _str[i] = _str[i + nToDel];
    }
    resize(prevSize - nToDel);
}